

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O1

void __thiscall
HelpGameCommand::trigger
          (HelpGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  int iVar1;
  int iVar2;
  Server *pSVar3;
  char *in_R9;
  undefined1 auVar4 [16];
  uint cmdCount;
  GameCommand *cmd;
  string msg;
  anon_class_24_3_c4a9eb0b getAccessCommands;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  split_parameters;
  Server *local_c0;
  int local_b4;
  undefined8 *local_b0;
  string local_a8;
  string local_88;
  Server **local_68;
  undefined8 **local_60;
  int *local_58;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  
  local_68 = &local_c0;
  local_58 = &local_b4;
  local_b4 = 0;
  local_60 = &local_b0;
  local_c0 = source;
  jessilib::
  word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
            (&local_50,(jessilib *)parameters._M_str,
             (char *)((jessilib *)parameters._M_str + parameters._M_len)," \t","",in_R9);
  if (local_50.first._M_len == 0) {
    if (-1 < player->access) {
      iVar2 = -1;
      do {
        iVar2 = iVar2 + 1;
        trigger(RenX::Server*,RenX::PlayerInfo*,std::basic_string_view<char,std::char_traits<char>>)
        ::$_0::operator()[abi_cxx11_(&local_88,&local_68,iVar2);
        pSVar3 = local_c0;
        if (local_88._M_string_length != 0) {
          trigger(RenX::Server*,RenX::PlayerInfo*,std::basic_string_view<char,std::char_traits<char>>)
          ::$_0::operator()[abi_cxx11_(&local_a8,&local_68,iVar2);
          RenX::Server::sendMessage
                    (pSVar3,player,local_a8._M_string_length,local_a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      } while (iVar2 < player->access);
    }
    if (local_b4 != 0) {
      return;
    }
    auVar4._8_8_ = "No listed commands available.";
    auVar4._0_8_ = 0x1d;
    pSVar3 = local_c0;
  }
  else {
    local_b0 = (undefined8 *)
               RenX::Server::getCommand(local_c0,local_50.first._M_len,local_50.first._M_str);
    if (local_b0 == (undefined8 *)0x0) {
      auVar4._8_8_ = "Error: Command not found.";
      auVar4._0_8_ = 0x19;
      pSVar3 = local_c0;
    }
    else {
      iVar2 = player->access;
      iVar1 = RenX::GameCommand::getAccessLevel();
      pSVar3 = local_c0;
      if (iVar2 < iVar1) {
        auVar4._8_8_ = "Access Denied.";
        auVar4._0_8_ = 0xe;
      }
      else {
        auVar4 = (**(code **)*local_b0)(local_b0,local_50.second._M_len,local_50.second._M_str);
      }
    }
  }
  RenX::Server::sendMessage(pSVar3,player,auVar4._0_8_,auVar4._8_8_);
  return;
}

Assistant:

void HelpGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	RenX::GameCommand *cmd;
	unsigned int cmdCount = 0;
	auto getAccessCommands = [&](int accessLevel) {
		std::string list;
		unsigned int i = 0;
		while (i != source->getCommandCount()) {
			cmd = source->getCommand(i++);
			if (cmd->getAccessLevel() == accessLevel) {
				cmdCount++;
				list = "Access level "s + std::to_string(accessLevel) + " commands: "s;
				list += cmd->getTrigger();
				break;
			}
		}
		while (i != source->getCommandCount()) {
			cmd = source->getCommand(i++);
			if (cmd->getAccessLevel() == accessLevel) {
				cmdCount++;
				list += ", ";
				list += cmd->getTrigger();
			}
		}
		return list;
	};

	auto split_parameters = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (split_parameters.first.empty()) {
		for (int i = 0; i <= player->access; i++) {
			auto msg = getAccessCommands(i);
			if (!msg.empty()) {
				source->sendMessage(*player, getAccessCommands(i));
			}
		}
		if (cmdCount == 0) {
			source->sendMessage(*player, "No listed commands available."sv);
		}
	}
	else {
		cmd = source->getCommand(split_parameters.first);
		if (cmd != nullptr) {
			if (player->access >= cmd->getAccessLevel()) {
				source->sendMessage(*player, cmd->getHelp(split_parameters.second));
			}
			else {
				source->sendMessage(*player, "Access Denied."sv);
			}
		}
		else {
			source->sendMessage(*player, "Error: Command not found."sv);
		}
	}
}